

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct32x32_low8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  __m128i cospi32;
  __m128i cospim16;
  __m128i cospi16;
  __m128i cospim48;
  __m128i cospi48;
  __m128i clamp_hi;
  __m128i rounding;
  __m128i cospim32;
  __m128i cospi40;
  __m128i cospi24;
  __m128i clamp_lo;
  __m128i cospim24;
  __m128i cospim56;
  __m128i cospim8;
  __m128i cospim40;
  __m128i cospi8;
  __m128i cospi56;
  int local_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  int local_228;
  int iStack_224;
  int iStack_220;
  int iStack_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  lVar14 = (long)bit * 0x100;
  uVar4 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 600);
  uVar5 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x198);
  uVar6 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x238);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x178);
  uVar7 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x188);
  uVar8 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x168);
  iVar10 = -*(int *)((long)vert_filter_length_chroma + lVar14 + 0x248);
  iVar11 = -*(int *)((long)vert_filter_length_chroma + lVar14 + 0x228);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x250);
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 400);
  uVar9 = *(undefined4 *)((long)vert_filter_length_chroma + lVar14 + 0x170);
  iVar12 = -*(int *)((long)vert_filter_length_chroma + lVar14 + 0x230);
  cospi56[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x240);
  cospi24[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x1c0);
  cospi40[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x200);
  cospi8[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x180);
  cospim40[0]._0_4_ = -(int)cospi40[0];
  cospim8[0]._0_4_ = -(int)cospi8[0];
  cospim56[0]._0_4_ = -(int)cospi56[0];
  cospim24[0]._0_4_ = -(int)cospi24[0];
  cospi32[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x1e0);
  cospim32[0]._0_4_ = -(int)cospi32[0];
  cospi16[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x1a0);
  cospi48[0]._0_4_ = *(int *)((long)vert_filter_length_chroma + lVar14 + 0x220);
  cospim48[0]._0_4_ = -(int)cospi48[0];
  cospim16[0]._0_4_ = -(int)cospi16[0];
  iVar15 = 1 << ((char)bit - 1U & 0x1f);
  iVar16 = bd + (uint)(do_cols == 0) * 2;
  iVar13 = 0x8000;
  if (0xf < iVar16 + 6) {
    iVar13 = 1 << ((char)iVar16 + 5U & 0x1f);
  }
  clamp_lo[0]._0_4_ = -iVar13;
  clamp_hi[0]._0_4_ = iVar13 + -1;
  auVar30._4_4_ = uVar4;
  auVar30._0_4_ = uVar4;
  auVar30._8_4_ = uVar4;
  auVar30._12_4_ = uVar4;
  auVar26._4_4_ = uVar5;
  auVar26._0_4_ = uVar5;
  auVar26._8_4_ = uVar5;
  auVar26._12_4_ = uVar5;
  auVar33._4_4_ = uVar6;
  auVar33._0_4_ = uVar6;
  auVar33._8_4_ = uVar6;
  auVar33._12_4_ = uVar6;
  auVar29._4_4_ = uVar7;
  auVar29._0_4_ = uVar7;
  auVar29._8_4_ = uVar7;
  auVar29._12_4_ = uVar7;
  auVar27._4_4_ = uVar8;
  auVar27._0_4_ = uVar8;
  auVar27._8_4_ = uVar8;
  auVar27._12_4_ = uVar8;
  auVar31._4_4_ = iVar11;
  auVar31._0_4_ = iVar11;
  auVar31._8_4_ = iVar11;
  auVar31._12_4_ = iVar11;
  local_238 = (int)(*in)[0];
  iStack_234 = (int)((ulong)(*in)[0] >> 0x20);
  iStack_230 = (int)(*in)[1];
  iStack_22c = (int)((ulong)(*in)[1] >> 0x20);
  iStack_1ec = (int)((ulong)in[4][1] >> 0x20);
  auVar25 = pmulld(auVar27,(undefined1  [16])in[1]);
  auVar30 = pmulld(auVar30,(undefined1  [16])in[1]);
  auVar27 = pmulld(auVar31,(undefined1  [16])in[7]);
  auVar24 = pmulld(auVar26,(undefined1  [16])in[7]);
  auVar26 = pmulld(auVar29,(undefined1  [16])in[5]);
  auVar31 = pmulld(auVar33,(undefined1  [16])in[5]);
  auVar28._4_4_ = uVar1;
  auVar28._0_4_ = uVar1;
  auVar28._8_4_ = uVar1;
  auVar28._12_4_ = uVar1;
  auVar32._4_4_ = iVar10;
  auVar32._0_4_ = iVar10;
  auVar32._8_4_ = iVar10;
  auVar32._12_4_ = iVar10;
  auVar33 = pmulld(auVar32,(undefined1  [16])in[3]);
  auVar29 = pmulld(auVar28,(undefined1  [16])in[3]);
  auVar22._4_4_ = uVar2;
  auVar22._0_4_ = uVar2;
  auVar22._8_4_ = uVar2;
  auVar22._12_4_ = uVar2;
  auVar18._4_4_ = uVar3;
  auVar18._0_4_ = uVar3;
  auVar18._8_4_ = uVar3;
  auVar18._12_4_ = uVar3;
  auVar21._4_4_ = uVar9;
  auVar21._0_4_ = uVar9;
  auVar21._8_4_ = uVar9;
  auVar21._12_4_ = uVar9;
  auVar19._4_4_ = iVar12;
  auVar19._0_4_ = iVar12;
  auVar19._8_4_ = iVar12;
  auVar19._12_4_ = iVar12;
  auVar17 = pmulld(auVar21,(undefined1  [16])in[2]);
  auVar23 = pmulld(auVar22,(undefined1  [16])in[2]);
  auVar21 = ZEXT416((uint)bit);
  local_58 = auVar25._0_4_ + iVar15 >> auVar21;
  iStack_54 = auVar25._4_4_ + iVar15 >> auVar21;
  iStack_50 = auVar25._8_4_ + iVar15 >> auVar21;
  iStack_4c = auVar25._12_4_ + iVar15 >> auVar21;
  auVar20 = pmulld(auVar19,(undefined1  [16])in[6]);
  auVar25 = pmulld(auVar18,(undefined1  [16])in[6]);
  local_138 = auVar30._0_4_ + iVar15 >> auVar21;
  iStack_134 = auVar30._4_4_ + iVar15 >> auVar21;
  iStack_130 = auVar30._8_4_ + iVar15 >> auVar21;
  iStack_12c = auVar30._12_4_ + iVar15 >> auVar21;
  local_118 = auVar27._0_4_ + iVar15 >> auVar21;
  iStack_114 = auVar27._4_4_ + iVar15 >> auVar21;
  iStack_110 = auVar27._8_4_ + iVar15 >> auVar21;
  iStack_10c = auVar27._12_4_ + iVar15 >> auVar21;
  local_78 = auVar24._0_4_ + iVar15 >> auVar21;
  iStack_74 = auVar24._4_4_ + iVar15 >> auVar21;
  iStack_70 = auVar24._8_4_ + iVar15 >> auVar21;
  iStack_6c = auVar24._12_4_ + iVar15 >> auVar21;
  local_98 = auVar26._0_4_ + iVar15 >> auVar21;
  iStack_94 = auVar26._4_4_ + iVar15 >> auVar21;
  iStack_90 = auVar26._8_4_ + iVar15 >> auVar21;
  iStack_8c = auVar26._12_4_ + iVar15 >> auVar21;
  local_f8 = auVar31._0_4_ + iVar15 >> auVar21;
  iStack_f4 = auVar31._4_4_ + iVar15 >> auVar21;
  iStack_f0 = auVar31._8_4_ + iVar15 >> auVar21;
  iStack_ec = auVar31._12_4_ + iVar15 >> auVar21;
  local_d8 = auVar33._0_4_ + iVar15 >> auVar21;
  iStack_d4 = auVar33._4_4_ + iVar15 >> auVar21;
  iStack_d0 = auVar33._8_4_ + iVar15 >> auVar21;
  iStack_cc = auVar33._12_4_ + iVar15 >> auVar21;
  local_b8 = auVar29._0_4_ + iVar15 >> auVar21;
  iStack_b4 = auVar29._4_4_ + iVar15 >> auVar21;
  iStack_b0 = auVar29._8_4_ + iVar15 >> auVar21;
  iStack_ac = auVar29._12_4_ + iVar15 >> auVar21;
  local_158 = auVar17._0_4_ + iVar15 >> auVar21;
  iStack_154 = auVar17._4_4_ + iVar15 >> auVar21;
  iStack_150 = auVar17._8_4_ + iVar15 >> auVar21;
  iStack_14c = auVar17._12_4_ + iVar15 >> auVar21;
  local_1b8 = auVar23._0_4_ + iVar15 >> auVar21;
  iStack_1b4 = auVar23._4_4_ + iVar15 >> auVar21;
  iStack_1b0 = auVar23._8_4_ + iVar15 >> auVar21;
  iStack_1ac = auVar23._12_4_ + iVar15 >> auVar21;
  local_198 = auVar20._0_4_ + iVar15 >> auVar21;
  iStack_194 = auVar20._4_4_ + iVar15 >> auVar21;
  iStack_190 = auVar20._8_4_ + iVar15 >> auVar21;
  iStack_18c = auVar20._12_4_ + iVar15 >> auVar21;
  local_178 = auVar25._0_4_ + iVar15 >> auVar21;
  iStack_174 = auVar25._4_4_ + iVar15 >> auVar21;
  iStack_170 = auVar25._8_4_ + iVar15 >> auVar21;
  iStack_16c = auVar25._12_4_ + iVar15 >> auVar21;
  auVar24._12_4_ = iStack_1ec;
  auVar24._0_12_ = *(undefined1 (*) [12])in[4];
  auVar25._4_4_ = (int)cospi8[0];
  auVar25._0_4_ = (int)cospi8[0];
  auVar25._8_4_ = (int)cospi8[0];
  auVar25._12_4_ = (int)cospi8[0];
  auVar17 = pmulld(auVar25,auVar24);
  local_1c8 = auVar17._0_4_ + iVar15 >> auVar21;
  iStack_1c4 = auVar17._4_4_ + iVar15 >> auVar21;
  iStack_1c0 = auVar17._8_4_ + iVar15 >> auVar21;
  iStack_1bc = auVar17._12_4_ + iVar15 >> auVar21;
  auVar20._4_4_ = (int)cospi56[0];
  auVar20._0_4_ = (int)cospi56[0];
  auVar20._8_4_ = (int)cospi56[0];
  auVar20._12_4_ = (int)cospi56[0];
  auVar17 = pmulld(auVar24,auVar20);
  local_1f8 = auVar17._0_4_ + iVar15 >> auVar21;
  iStack_1f4 = auVar17._4_4_ + iVar15 >> auVar21;
  iStack_1f0 = auVar17._8_4_ + iVar15 >> auVar21;
  iStack_1ec = auVar17._12_4_ + iVar15 >> auVar21;
  cospi32[0]._4_4_ = (int)cospi32[0];
  cospi32[1]._0_4_ = (int)cospi32[0];
  cospi32[1]._4_4_ = (int)cospi32[0];
  cospim16[0]._4_4_ = (int)cospim16[0];
  cospim16[1]._0_4_ = (int)cospim16[0];
  cospim16[1]._4_4_ = (int)cospim16[0];
  cospi16[0]._4_4_ = (int)cospi16[0];
  cospi16[1]._0_4_ = (int)cospi16[0];
  cospi16[1]._4_4_ = (int)cospi16[0];
  cospim48[0]._4_4_ = (int)cospim48[0];
  cospim48[1]._0_4_ = (int)cospim48[0];
  cospim48[1]._4_4_ = (int)cospim48[0];
  cospi48[0]._4_4_ = (int)cospi48[0];
  cospi48[1]._0_4_ = (int)cospi48[0];
  cospi48[1]._4_4_ = (int)cospi48[0];
  clamp_hi[0]._4_4_ = (int)clamp_hi[0];
  clamp_hi[1]._0_4_ = (int)clamp_hi[0];
  clamp_hi[1]._4_4_ = (int)clamp_hi[0];
  rounding[0]._0_4_ = iVar15;
  rounding[0]._4_4_ = iVar15;
  rounding[1]._0_4_ = iVar15;
  rounding[1]._4_4_ = iVar15;
  cospim32[0]._4_4_ = (int)cospim32[0];
  cospim32[1]._0_4_ = (int)cospim32[0];
  cospim32[1]._4_4_ = (int)cospim32[0];
  cospi40[0]._4_4_ = (int)cospi40[0];
  cospi40[1]._0_4_ = (int)cospi40[0];
  cospi40[1]._4_4_ = (int)cospi40[0];
  cospi24[0]._4_4_ = (int)cospi24[0];
  cospi24[1]._0_4_ = (int)cospi24[0];
  cospi24[1]._4_4_ = (int)cospi24[0];
  clamp_lo[0]._4_4_ = (int)clamp_lo[0];
  clamp_lo[1]._0_4_ = (int)clamp_lo[0];
  clamp_lo[1]._4_4_ = (int)clamp_lo[0];
  cospim24[0]._4_4_ = (int)cospim24[0];
  cospim24[1]._0_4_ = (int)cospim24[0];
  cospim24[1]._4_4_ = (int)cospim24[0];
  cospim56[0]._4_4_ = (int)cospim56[0];
  cospim56[1]._0_4_ = (int)cospim56[0];
  cospim56[1]._4_4_ = (int)cospim56[0];
  cospim8[0]._4_4_ = (int)cospim8[0];
  cospim8[1]._0_4_ = (int)cospim8[0];
  cospim8[1]._4_4_ = (int)cospim8[0];
  cospim40[0]._4_4_ = (int)cospim40[0];
  cospim40[1]._0_4_ = (int)cospim40[0];
  cospim40[1]._4_4_ = (int)cospim40[0];
  cospi8[0]._4_4_ = (int)cospi8[0];
  cospi8[1]._0_4_ = (int)cospi8[0];
  cospi8[1]._4_4_ = (int)cospi8[0];
  cospi56[0]._4_4_ = (int)cospi56[0];
  cospi56[1]._0_4_ = (int)cospi56[0];
  cospi56[1]._4_4_ = (int)cospi56[0];
  local_1a8 = local_1b8;
  iStack_1a4 = iStack_1b4;
  iStack_1a0 = iStack_1b0;
  iStack_19c = iStack_1ac;
  local_188 = local_198;
  iStack_184 = iStack_194;
  iStack_180 = iStack_190;
  iStack_17c = iStack_18c;
  local_168 = local_178;
  iStack_164 = iStack_174;
  iStack_160 = iStack_170;
  iStack_15c = iStack_16c;
  local_148 = local_158;
  iStack_144 = iStack_154;
  iStack_140 = iStack_150;
  iStack_13c = iStack_14c;
  local_128 = local_138;
  iStack_124 = iStack_134;
  iStack_120 = iStack_130;
  iStack_11c = iStack_12c;
  local_108 = local_118;
  iStack_104 = iStack_114;
  iStack_100 = iStack_110;
  iStack_fc = iStack_10c;
  local_e8 = local_f8;
  iStack_e4 = iStack_f4;
  iStack_e0 = iStack_f0;
  iStack_dc = iStack_ec;
  local_c8 = local_d8;
  iStack_c4 = iStack_d4;
  iStack_c0 = iStack_d0;
  iStack_bc = iStack_cc;
  local_a8 = local_b8;
  iStack_a4 = iStack_b4;
  iStack_a0 = iStack_b0;
  iStack_9c = iStack_ac;
  local_88 = local_98;
  iStack_84 = iStack_94;
  iStack_80 = iStack_90;
  iStack_7c = iStack_8c;
  local_68 = local_78;
  iStack_64 = iStack_74;
  iStack_60 = iStack_70;
  iStack_5c = iStack_6c;
  local_48 = local_58;
  iStack_44 = iStack_54;
  iStack_40 = iStack_50;
  iStack_3c = iStack_4c;
  idct32_stage4_sse4_1
            ((__m128i *)&local_238,&cospim8,&cospi56,&cospi8,&cospim56,&cospim40,&cospi24,&cospi40,
             &cospim24,&rounding,bit);
  auVar23._4_4_ = iStack_234;
  auVar23._0_4_ = local_238;
  auVar23._8_4_ = iStack_230;
  auVar23._12_4_ = iStack_22c;
  local_1e8 = CONCAT44(iStack_1f4,local_1f8);
  uStack_1e0 = CONCAT44(iStack_1ec,iStack_1f0);
  auVar17._4_4_ = cospi32[0]._4_4_;
  auVar17._0_4_ = (int)cospi32[0];
  auVar17._8_4_ = (int)cospi32[1];
  auVar17._12_4_ = cospi32[1]._4_4_;
  auVar17 = pmulld(auVar23,auVar17);
  local_1d8 = CONCAT44(iStack_1c4,local_1c8);
  uStack_1d0 = CONCAT44(iStack_1bc,iStack_1c0);
  local_238 = auVar17._0_4_ + iVar15 >> auVar21;
  iStack_234 = auVar17._4_4_ + iVar15 >> auVar21;
  iStack_230 = auVar17._8_4_ + iVar15 >> auVar21;
  iStack_22c = auVar17._12_4_ + iVar15 >> auVar21;
  local_228 = local_238;
  iStack_224 = iStack_234;
  iStack_220 = iStack_230;
  iStack_21c = iStack_22c;
  idct32_stage5_sse4_1
            ((__m128i *)&local_238,&cospim16,&cospi48,&cospi16,&cospim48,&clamp_lo,&clamp_hi,
             &rounding,bit);
  local_208 = CONCAT44(iStack_234,local_238);
  uStack_200 = CONCAT44(iStack_22c,iStack_230);
  local_218 = CONCAT44(iStack_224,local_228);
  uStack_210 = CONCAT44(iStack_21c,iStack_220);
  idct32_stage6_sse4_1
            ((__m128i *)&local_238,&cospim32,&cospi32,&cospim16,&cospi48,&cospi16,&cospim48,
             &clamp_lo,&clamp_hi,&rounding,bit);
  idct32_stage7_sse4_1((__m128i *)&local_238,&cospim32,&cospi32,&clamp_lo,&clamp_hi,&rounding,bit);
  idct32_stage8_sse4_1((__m128i *)&local_238,&cospim32,&cospi32,&clamp_lo,&clamp_hi,&rounding,bit);
  idct32_stage9_sse4_1((__m128i *)&local_238,out,do_cols,bd,out_shift,&clamp_lo,&clamp_hi);
  return;
}

Assistant:

static void idct32x32_low8_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i cospim50 = _mm_set1_epi32(-cospi[50]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i rounding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i bf1[32];

  // stage 0
  // stage 1
  bf1[0] = in[0];
  bf1[4] = in[4];
  bf1[8] = in[2];
  bf1[12] = in[6];
  bf1[16] = in[1];
  bf1[20] = in[5];
  bf1[24] = in[3];
  bf1[28] = in[7];

  // stage 2
  bf1[31] = half_btf_0_sse4_1(&cospi2, &bf1[16], &rounding, bit);
  bf1[16] = half_btf_0_sse4_1(&cospi62, &bf1[16], &rounding, bit);
  bf1[19] = half_btf_0_sse4_1(&cospim50, &bf1[28], &rounding, bit);
  bf1[28] = half_btf_0_sse4_1(&cospi14, &bf1[28], &rounding, bit);
  bf1[27] = half_btf_0_sse4_1(&cospi10, &bf1[20], &rounding, bit);
  bf1[20] = half_btf_0_sse4_1(&cospi54, &bf1[20], &rounding, bit);
  bf1[23] = half_btf_0_sse4_1(&cospim58, &bf1[24], &rounding, bit);
  bf1[24] = half_btf_0_sse4_1(&cospi6, &bf1[24], &rounding, bit);

  // stage 3
  bf1[15] = half_btf_0_sse4_1(&cospi4, &bf1[8], &rounding, bit);
  bf1[8] = half_btf_0_sse4_1(&cospi60, &bf1[8], &rounding, bit);

  bf1[11] = half_btf_0_sse4_1(&cospim52, &bf1[12], &rounding, bit);
  bf1[12] = half_btf_0_sse4_1(&cospi12, &bf1[12], &rounding, bit);
  bf1[17] = bf1[16];
  bf1[18] = bf1[19];
  bf1[21] = bf1[20];
  bf1[22] = bf1[23];
  bf1[25] = bf1[24];
  bf1[26] = bf1[27];
  bf1[29] = bf1[28];
  bf1[30] = bf1[31];

  // stage 4 :
  bf1[7] = half_btf_0_sse4_1(&cospi8, &bf1[4], &rounding, bit);
  bf1[4] = half_btf_0_sse4_1(&cospi56, &bf1[4], &rounding, bit);

  bf1[9] = bf1[8];
  bf1[10] = bf1[11];
  bf1[13] = bf1[12];
  bf1[14] = bf1[15];

  idct32_stage4_sse4_1(bf1, &cospim8, &cospi56, &cospi8, &cospim56, &cospim40,
                       &cospi24, &cospi40, &cospim24, &rounding, bit);

  // stage 5
  bf1[0] = half_btf_0_sse4_1(&cospi32, &bf1[0], &rounding, bit);
  bf1[1] = bf1[0];
  bf1[5] = bf1[4];
  bf1[6] = bf1[7];

  idct32_stage5_sse4_1(bf1, &cospim16, &cospi48, &cospi16, &cospim48, &clamp_lo,
                       &clamp_hi, &rounding, bit);

  // stage 6
  bf1[3] = bf1[0];
  bf1[2] = bf1[1];

  idct32_stage6_sse4_1(bf1, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rounding, bit);

  // stage 7
  idct32_stage7_sse4_1(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

  // stage 8
  idct32_stage8_sse4_1(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

  // stage 9
  idct32_stage9_sse4_1(bf1, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
}